

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O2

void avro::codec_traits<testgen::RootRecord>::encode(Encoder *e,RootRecord *v)

{
  (**(code **)(*(long *)e + 0x38))(e,v->mylong);
  codec_traits<testgen::Nested>::encode(e,&v->nestedrecord);
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::encode(e,&v->mymap);
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested>_>_>_>
  ::encode(e,&v->recordmap);
  codec_traits<std::vector<double,_std::allocator<double>_>_>::encode(e,&v->myarray);
  encode<testgen::ExampleEnum>(e,&v->myenum);
  encode<testgen::_bigrecord_Union__0__>(e,&v->myunion);
  encode<testgen::_bigrecord_Union__1__>(e,&v->anotherunion);
  (**(code **)(*(long *)e + 0x28))(e,v->mybool);
  codec_traits<testgen::Nested>::encode(e,&v->anothernested);
  (**(code **)(*(long *)e + 0x60))(e,&v->myfixed,0x10);
  (**(code **)(*(long *)e + 0x30))(e,v->anotherint);
  Encoder::encodeBytes(e,&v->bytes);
  return;
}

Assistant:

static void encode(Encoder& e, const testgen::RootRecord& v) {
        avro::encode(e, v.mylong);
        avro::encode(e, v.nestedrecord);
        avro::encode(e, v.mymap);
        avro::encode(e, v.recordmap);
        avro::encode(e, v.myarray);
        avro::encode(e, v.myenum);
        avro::encode(e, v.myunion);
        avro::encode(e, v.anotherunion);
        avro::encode(e, v.mybool);
        avro::encode(e, v.anothernested);
        avro::encode(e, v.myfixed);
        avro::encode(e, v.anotherint);
        avro::encode(e, v.bytes);
    }